

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O0

void __thiscall helics::apps::Recorder::processArgs(Recorder *this)

{
  long in_RDI;
  AppFormatMode in_stack_0000003c;
  string *in_stack_00000040;
  App *in_stack_00000048;
  shared_ptr<helics::helicsCLI11App> app;
  helicsCLI11App *in_stack_000000f0;
  Recorder *in_stack_000005c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff78;
  App *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_69 [25];
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  buildArgParserApp(in_stack_000005c8);
  if ((*(byte *)(in_RDI + 0x82) & 1) == 0) {
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x20b0de);
    CLI::App::parse(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else if ((*(byte *)(in_RDI + 0x84) & 1) != 0) {
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x20b128);
    helicsCLI11App::remove_helics_specifics(in_stack_000000f0);
    CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x20b13c);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    CLI::App::help(in_stack_00000048,in_stack_00000040,in_stack_0000003c);
    std::operator<<((ostream *)&std::cout,(string *)&stack0xffffffffffffffb8);
    std::__cxx11::string::~string(this_00);
    std::__cxx11::string::~string(this_00);
    std::allocator<char>::~allocator(local_69);
  }
  CLI::std::shared_ptr<helics::helicsCLI11App>::~shared_ptr
            ((shared_ptr<helics::helicsCLI11App> *)0x20b20b);
  return;
}

Assistant:

void Recorder::processArgs()
{
    auto app = buildArgParserApp();
    if (!deactivated) {
        app->parse(remArgs);
    } else if (helpMode) {
        app->remove_helics_specifics();
        std::cout << app->help();
    }
}